

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  pointer puVar4;
  RegisterData RVar5;
  void *pvVar6;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  size_t seconds;
  DateTimeData dtd1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> factoryReset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r2Enc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dtd1Enc;
  RegisterData r1;
  RegisterData r2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> algClearTare;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r1Enc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r1Test;
  pointer puStack_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r2Test;
  void *pvStack_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dtd1Test;
  pointer puStack_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packet;
  
  puStack_38 = (pointer)0x0;
  packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __l._M_len = 5;
  __l._M_array = &stack0xfffffffffffffeb0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dtd1._seconds,__l,
             (allocator_type *)&r2);
  iVar2 = 1;
  ximu::PacketConstruction::
  constructCommandPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (FACTORY_RESET,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&puStack_38);
  puVar4 = puStack_38;
  pvVar6 = (void *)dtd1._seconds;
  if ((long)packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start - (long)puStack_38 !=
      (long)factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start - dtd1._seconds) goto LAB_001025cc;
  if (packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != puStack_38) {
    iVar1 = bcmp(puStack_38,(void *)dtd1._seconds,
                 (long)packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start - (long)puStack_38);
    if (iVar1 != 0) goto LAB_001025cc;
    packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
  }
  __l_00._M_len = 5;
  __l_00._M_array = &stack0xfffffffffffffeb0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&r2,__l_00,
             (allocator_type *)
             &algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  ximu::PacketConstruction::
  constructCommandPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (ALGORITHM_CLEAR_TARE,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&puStack_38);
  RVar5 = r2;
  if (((long)packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start - (long)puStack_38 ==
       (long)algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start - (long)r2) &&
     ((packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start == puStack_38 ||
      (iVar1 = bcmp(puStack_38,(void *)r2,
                    (long)packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)puStack_38), iVar1 == 0))
     )) {
    ximu::RegisterData::RegisterData
              ((RegisterData *)
               &dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,ADXL_345C_SENSITIVITY_X,11.0);
    __l_01._M_len = 7;
    __l_01._M_array = &stack0xfffffffffffffeb0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,__l_01,
               (allocator_type *)
               &r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ximu::PacketConstruction::
    constructWriteRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((RegisterData *)
               &dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
               &r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    puVar4 = r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((-(long)r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage ==
         (long)r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start -
         (long)algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) &&
       ((r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage == (pointer)0x0 ||
        (iVar1 = bcmp(r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      -(long)r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar1 == 0)))) {
      ximu::RegisterData::RegisterData(&r1,BATTERY_SHUTDOWN_VOLTAGE);
      __l_02._M_len = 5;
      __l_02._M_array = &stack0xfffffffffffffeb0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,__l_02,
                 (allocator_type *)&puStack_78);
      puStack_78 = (pointer)0x0;
      r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ximu::PacketConstruction::
      constructReadRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&r1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&puStack_78);
      puVar4 = puStack_78;
      if (((long)r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start - (long)puStack_78 ==
           (long)r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start -
           (long)factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) &&
         ((r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start == puStack_78 ||
          (iVar1 = bcmp(puStack_78,
                        factoryReset.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)r2Test.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)puStack_78),
          iVar1 == 0)))) {
        seconds = 0x304a403820024502;
        dtd1._year._0_2_ = 0xc04b;
        __l_03._M_len = 10;
        __l_03._M_array = &stack0xfffffffffffffeb0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,__l_03,(allocator_type *)&pvStack_58);
        pvStack_58 = (void *)0x0;
        dtd1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dtd1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ximu::DateTimeData::DateTimeData
                  ((DateTimeData *)&stack0xfffffffffffffeb0,0x7de,0xc,7,10,0x19,seconds);
        ximu::PacketConstruction::
        constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((DateTimeData *)&stack0xfffffffffffffeb0,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pvStack_58);
        pvVar6 = pvStack_58;
        puVar3 = r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if ((long)dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start -
            (long)r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage ==
            (long)dtd1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start - (long)pvStack_58) {
          iVar2 = 0;
          if ((dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start !=
               r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) &&
             (iVar1 = bcmp(r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,pvStack_58,
                           (long)dtd1Enc.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start -
                           (long)r2Enc.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage), iVar2 = 0,
             iVar1 != 0)) goto LAB_00102544;
        }
        else {
LAB_00102544:
          iVar2 = 1;
        }
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6);
          puVar3 = r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        puVar4 = puStack_78;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
          puVar4 = puStack_78;
        }
      }
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(factoryReset.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        puVar4 = r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
    }
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    RVar5 = r2;
    if (algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      RVar5 = r2;
    }
  }
  pvVar6 = (void *)dtd1._seconds;
  if (RVar5 != (RegisterData)0x0) {
    operator_delete((void *)RVar5);
    pvVar6 = (void *)dtd1._seconds;
  }
LAB_001025cc:
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6);
  }
  if (puStack_38 != (pointer)0x0) {
    operator_delete(puStack_38);
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
  // the factory-reset command byte sequence has been extracted
  // from the c# gui application.
  // The test is to create the same byte sequence
  std::vector<unsigned char> packet;
  std::vector<unsigned char> factoryReset {0, 64, 0, 16, 144};

  ximu::PacketConstruction::constructCommandPacket(
      ximu::CommandCodes::FACTORY_RESET, back_inserter(packet));

  if (packet != factoryReset)
    return 1;

  // same test as the previous only now the command is the
  // algorithm clear tare command.
  packet.clear();
  std::vector<unsigned char> algClearTare {0, 64, 1, 113, 128};

  ximu::PacketConstruction::constructCommandPacket(
      ximu::CommandCodes::ALGORITHM_CLEAR_TARE, back_inserter(packet));

  if (packet != algClearTare)
    return 1;


  // Constucting RegisterData read/write 
  // write packet
  ximu::RegisterData r1(ximu::reg::RegisterAddresses::ADXL_345C_SENSITIVITY_X,11.0f);
  std::vector<unsigned char> r1Enc {1, 64, 12, 32,  22, 0, 206};	
  std::vector<unsigned char> r1Test;
  ximu::PacketConstruction::constructWriteRegisterPacket(r1,back_inserter(r1Test));

  if (r1Test != r1Enc)
    return 1;
  
  //read packet
  ximu::RegisterData r2(ximu::reg::RegisterAddresses::BATTERY_SHUTDOWN_VOLTAGE);
  std::vector<unsigned char> r2Enc {1, 0, 9, 4, 208};
  std::vector<unsigned char> r2Test;
  ximu::PacketConstruction::constructReadRegisterPacket(r2,back_inserter(r2Test));


  if (r2Test != r2Enc)
    return 1;

  // Constucting of the DateTimeData
  std::vector<unsigned char> dtd1Enc {2, 69, 2, 32, 56, 64, 74, 48, 75, 192};
  std::vector<unsigned char> dtd1Test;
  ximu::DateTimeData dtd1(2014, 12, 07, 10, 25, 30);
  ximu::PacketConstruction::constructWriteDateTimePacket(dtd1,back_inserter(dtd1Test));
  
  if (dtd1Enc != dtd1Test)
    return 1;
 
  
  
  return 0;
}